

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

int32_t add_to_bucket(ecs_bucket_t *bucket,ecs_size_t elem_size,ecs_map_key_t key,void *payload)

{
  int iVar1;
  ecs_map_key_t *peVar2;
  void *pvVar3;
  
  iVar1 = bucket->count;
  bucket->count = iVar1 + 1;
  peVar2 = (ecs_map_key_t *)(*ecs_os_api.realloc_)(bucket->keys,iVar1 * 8 + 8);
  bucket->keys = peVar2;
  pvVar3 = (*ecs_os_api.realloc_)(bucket->payload,(iVar1 + 1) * elem_size);
  bucket->payload = pvVar3;
  bucket->keys[iVar1] = key;
  if (payload != (void *)0x0) {
    memcpy((void *)((long)pvVar3 + (long)(iVar1 * elem_size)),payload,(long)elem_size);
  }
  return iVar1;
}

Assistant:

static
int32_t add_to_bucket(
    ecs_bucket_t *bucket,
    ecs_size_t elem_size,
    ecs_map_key_t key,
    const void *payload)
{
    int32_t index = bucket->count ++;
    int32_t bucket_count = index + 1;

    bucket->keys = ecs_os_realloc(bucket->keys, KEY_SIZE * bucket_count);
    bucket->payload = ecs_os_realloc(bucket->payload, elem_size * bucket_count);
    bucket->keys[index] = key;

    if (payload) {
        void *elem = GET_ELEM(bucket->payload, elem_size, index);
        ecs_os_memcpy(elem, payload, elem_size);
    }

    return index;
}